

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O2

void __thiscall QTuioHandler::process2DCurSet(QTuioHandler *this,QOscMessage *message)

{
  QVariant *pQVar1;
  int iVar2;
  QDebug *pQVar3;
  iterator iVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  float t;
  float t_00;
  float t_01;
  float t_02;
  float t_03;
  int cursorId;
  int local_8c;
  undefined1 local_88 [28];
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QArrayDataPointer<QVariant> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (message->m_arguments).d.d;
  pQVar1 = (message->m_arguments).d.ptr;
  local_50.size = (message->m_arguments).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.ptr = pQVar1;
  if ((ulong)local_50.size < 7) {
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
    goto LAB_0010929d;
    local_88._16_4_ = 2;
    local_88._20_8_ = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcTuioSet::category.name;
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_58,
                                "Ignoring malformed TUIO set message with too few arguments: ");
    QDebug::operator<<(pQVar3,local_50.size);
  }
  else {
    iVar2 = QVariant::typeId(pQVar1 + 1);
    if (iVar2 == 2) {
      iVar2 = QVariant::typeId(pQVar1 + 2);
      if (iVar2 == 0x26) {
        iVar2 = QVariant::typeId(pQVar1 + 3);
        if (iVar2 == 0x26) {
          iVar2 = QVariant::typeId(pQVar1 + 4);
          if (iVar2 == 0x26) {
            iVar2 = QVariant::typeId(pQVar1 + 5);
            if (iVar2 == 0x26) {
              iVar2 = QVariant::typeId(pQVar1 + 6);
              if (iVar2 == 0x26) {
                local_8c = QVariant::toInt((bool *)(pQVar1 + 1));
                t = (float)QVariant::toFloat((bool *)(pQVar1 + 2));
                t_00 = (float)QVariant::toFloat((bool *)(pQVar1 + 3));
                t_01 = (float)QVariant::toFloat((bool *)(pQVar1 + 4));
                t_02 = (float)QVariant::toFloat((bool *)(pQVar1 + 5));
                t_03 = (float)QVariant::toFloat((bool *)(pQVar1 + 6));
                iVar4 = QMap<int,_QTuioCursor>::find
                                  ((QMap<int,_QTuioCursor> *)(this + 0x28),&local_8c);
                iVar5._M_node =
                     (_Base_ptr)QMap<int,_QTuioCursor>::end((QMap<int,_QTuioCursor> *)(this + 0x28))
                ;
                lcTuioSet();
                if (iVar4.i._M_node != (iterator)iVar5._M_node) {
                  if (((byte)lcTuioSet::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                      1) != 0) {
                    local_88._16_4_ = 2;
                    local_88._20_8_ = 0;
                    uStack_6c = 0;
                    local_64 = 0;
                    local_60 = lcTuioSet::category.name;
                    QMessageLogger::debug();
                    pQVar3 = QDebug::operator<<(&local_58,"Processing SET for ");
                    pQVar3 = QDebug::operator<<(pQVar3,local_8c);
                    pQVar3 = QDebug::operator<<(pQVar3," x: ");
                    pQVar3 = QDebug::operator<<(pQVar3,t);
                    pQVar3 = QDebug::operator<<(pQVar3,t_00);
                    pQVar3 = QDebug::operator<<(pQVar3,t_01);
                    pQVar3 = QDebug::operator<<(pQVar3,t_02);
                    QDebug::operator<<(pQVar3,t_03);
                    QDebug::~QDebug(&local_58);
                  }
                  QTuioCursor::setX((QTuioCursor *)((long)iVar4.i._M_node + 0x24),t);
                  QTuioCursor::setY((QTuioCursor *)((long)iVar4.i._M_node + 0x24),t_00);
                  *(float *)((long)iVar4.i._M_node + 0x30) = t_01;
                  *(float *)((long)iVar4.i._M_node + 0x34) = t_02;
                  *(float *)((long)iVar4.i._M_node + 0x38) = t_03;
                  goto LAB_0010929d;
                }
                if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                    1) == 0) goto LAB_0010929d;
                local_88._16_4_ = 2;
                local_88._20_8_ = 0;
                uStack_6c = 0;
                local_64 = 0;
                local_60 = lcTuioSet::category.name;
                QMessageLogger::warning();
                pQVar3 = QDebug::operator<<(&local_58,
                                            "Ignoring malformed TUIO set for nonexistent cursor ");
                QDebug::operator<<(pQVar3,local_8c);
                goto LAB_0010933a;
              }
            }
          }
        }
      }
    }
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
    goto LAB_0010929d;
    local_88._16_4_ = 2;
    local_88._20_8_ = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcTuioSet::category.name;
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_58,"Ignoring malformed TUIO set message with bad types: ");
    local_88._0_8_ = pQVar3->stream;
    *(int *)(local_88._0_8_ + 0x28) = *(int *)(local_88._0_8_ + 0x28) + 1;
    operator<<((Stream *)(local_88 + 8),(QList<QVariant> *)local_88);
    QDebug::~QDebug((QDebug *)(local_88 + 8));
    QDebug::~QDebug((QDebug *)local_88);
  }
LAB_0010933a:
  QDebug::~QDebug(&local_58);
LAB_0010929d:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DCurSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int   ||
        QMetaType::Type(arguments.at(2).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float
       ) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int cursorId = arguments.at(1).toInt();
    float x = arguments.at(2).toFloat();
    float y = arguments.at(3).toFloat();
    float vx = arguments.at(4).toFloat();
    float vy = arguments.at(5).toFloat();
    float acceleration = arguments.at(6).toFloat();

    QMap<int, QTuioCursor>::Iterator it = m_activeCursors.find(cursorId);
    if (it == m_activeCursors.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent cursor " << cursorId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for " << cursorId << " x: " << x << y << vx << vy << acceleration;
    QTuioCursor &cur = *it;
    cur.setX(x);
    cur.setY(y);
    cur.setVX(vx);
    cur.setVY(vy);
    cur.setAcceleration(acceleration);
}